

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O2

void caption_frame_init(caption_frame_t *frame)

{
  xds_init(&frame->xds);
  frame->write = (caption_frame_buffer_t *)0x0;
  frame->timestamp = -1.0;
  *(undefined2 *)&frame->state = 0xe00;
  (frame->state).col = '\0';
  (frame->state).cc_data = 0;
  memset(&frame->front,0,0x1e00);
  return;
}

Assistant:

void caption_frame_init(caption_frame_t* frame)
{
    xds_init(&frame->xds);
    caption_frame_state_clear(frame);
    caption_frame_buffer_clear(&frame->back);
    caption_frame_buffer_clear(&frame->front);
}